

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O2

char * Memdup(char *data,size_t len)

{
  char *__dest;
  
  __dest = (char *)malloc(len + 1);
  if (__dest != (char *)0x0) {
    if (len != 0) {
      memcpy(__dest,data,len);
    }
    __dest[len] = '\0';
  }
  return __dest;
}

Assistant:

static char *Memdup(const char *data, size_t len)
{
  char *p = malloc(len + 1);
  if(!p)
    return NULL;
  if(len)
    memcpy(p, data, len);
  p[len] = 0;
  return p;
}